

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::Base64EscapeInternal
               (uchar *src,int szsrc,string *dest,bool do_padding,char *base64_chars)

{
  int iVar1;
  int iVar2;
  LogMessage *other;
  undefined8 uVar3;
  ulong uVar4;
  pointer dest_00;
  LogFinisher local_71;
  char *local_70;
  LogMessage local_68;
  
  local_70 = base64_chars;
  iVar1 = CalculateBase64EscapedLen(szsrc,do_padding);
  dest_00 = (char *)0x0;
  std::__cxx11::string::resize((ulong)dest,(char)iVar1);
  if (dest->_M_string_length != 0) {
    dest_00 = (dest->_M_dataplus)._M_p;
  }
  iVar2 = Base64EscapeInternal(src,szsrc,dest_00,(int)dest->_M_string_length,local_70,do_padding);
  if (iVar1 != iVar2) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x8ab);
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (calc_escaped_size) == (escaped_len): ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar4 = (ulong)iVar2;
  if (uVar4 <= dest->_M_string_length) {
    dest->_M_string_length = uVar4;
    (dest->_M_dataplus)._M_p[uVar4] = '\0';
    return;
  }
  uVar3 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase")
  ;
  internal::LogMessage::~LogMessage(&local_68);
  _Unwind_Resume(uVar3);
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, int szsrc,
                          string* dest, bool do_padding,
                          const char* base64_chars) {
  const int calc_escaped_size =
    CalculateBase64EscapedLen(szsrc, do_padding);
  dest->resize(calc_escaped_size);
  const int escaped_len = Base64EscapeInternal(src, szsrc,
                                               string_as_array(dest),
                                               dest->size(),
                                               base64_chars,
                                               do_padding);
  GOOGLE_DCHECK_EQ(calc_escaped_size, escaped_len);
  dest->erase(escaped_len);
}